

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int __thiscall ImGuiStorage::GetInt(ImGuiStorage *this,ImGuiID key,int default_val)

{
  ImGuiStoragePair *pIVar1;
  
  pIVar1 = LowerBound(&this->Data,key);
  if ((pIVar1 != (this->Data).Data + (this->Data).Size) && (pIVar1->key == key)) {
    default_val = (pIVar1->field_1).val_i;
  }
  return default_val;
}

Assistant:

int ImGuiStorage::GetInt(ImGuiID key, int default_val) const
{
    ImGuiStoragePair* it = LowerBound(const_cast<ImVector<ImGuiStoragePair>&>(Data), key);
    if (it == Data.end() || it->key != key)
        return default_val;
    return it->val_i;
}